

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd.c
# Opt level: O0

nsh_status_t nsh_cmd_init(nsh_cmd_t *cmd,char *name,nsh_cmd_handler_t *handler)

{
  size_t sVar1;
  size_t name_len;
  nsh_cmd_handler_t *handler_local;
  char *name_local;
  nsh_cmd_t *cmd_local;
  
  sVar1 = strlen(name);
  if ((sVar1 == 0) || (0x10 < sVar1)) {
    cmd_local._4_4_ = NSH_STATUS_WRONG_ARG;
  }
  else {
    strncpy(cmd->name,name,0x10);
    cmd->handler = handler;
    cmd_local._4_4_ = NSH_STATUS_OK;
  }
  return cmd_local._4_4_;
}

Assistant:

nsh_status_t nsh_cmd_init(nsh_cmd_t* cmd, const char* name, nsh_cmd_handler_t* handler)
{
    size_t name_len = strlen(name);
    if (name_len == 0 || name_len > NSH_MAX_STRING_SIZE) {
        return NSH_STATUS_WRONG_ARG;
    }

    strncpy(cmd->name, name, NSH_MAX_STRING_SIZE);
    cmd->handler = handler;
    return NSH_STATUS_OK;
}